

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

bool __thiscall c4::yml::Parser::_handle_indentation(Parser *this)

{
  State *pSVar1;
  ulong ahead;
  ulong uVar2;
  State *pSVar3;
  code *pcVar4;
  csubstr s;
  Location LVar5;
  Location LVar6;
  Location LVar7;
  Location LVar8;
  Location LVar9;
  bool bVar10;
  undefined1 uVar11;
  uint uVar12;
  size_t sVar13;
  NodeData *pNVar14;
  State *pSVar15;
  State *pSVar16;
  ro_substr chars;
  csubstr fmt;
  csubstr fmt_00;
  csubstr rem;
  char msg [31];
  csubstr remt;
  char *in_stack_fffffffffffffea8;
  size_t in_stack_fffffffffffffeb0;
  basic_substring<const_char> local_128;
  basic_substring<const_char> local_118;
  undefined6 uStack_108;
  undefined1 uStack_102;
  undefined1 uStack_101;
  undefined6 uStack_100;
  undefined1 uStack_fa;
  undefined1 uStack_f9;
  undefined6 uStack_f8;
  undefined1 uStack_f2;
  basic_substring<const_char> local_f0;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  char *pcStack_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  char *pcStack_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  char *pcStack_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  char *pcStack_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  char *pcStack_28;
  undefined8 local_20;
  
  if ((this->m_state->flags & 0x10) != 0) {
    uStack_108 = 0x6e6f6e5f7361;
    uStack_102 = 0x65;
    uStack_101 = 0x28;
    uStack_100 = 0x2929574f4c46;
    uStack_fa = 0;
    local_118.str = (char *)0x6166206b63656863;
    local_118.len._0_6_ = 0x203a64656c69;
    local_118.len._6_1_ = 0x28;
    local_118.len._7_1_ = 0x68;
    if (((s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
      pcVar4 = (code *)swi(3);
      uVar11 = (*pcVar4)();
      return (bool)uVar11;
    }
    local_40 = 0;
    uStack_38 = 0x7952;
    local_30 = 0;
    pcStack_28 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_20 = 0x65;
    in_stack_fffffffffffffea8 = (char *)0x0;
    in_stack_fffffffffffffeb0 = 0x7952;
    LVar5.super_LineCol.col = 0;
    LVar5.super_LineCol.offset = SUB168(ZEXT816(0x7952) << 0x40,0);
    LVar5.super_LineCol.line = SUB168(ZEXT816(0x7952) << 0x40,8);
    LVar5.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar5.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              ((char *)&local_118,0x1f,LVar5,(this->m_stack).m_callbacks.m_user_data);
  }
  pSVar1 = this->m_state;
  if ((pSVar1->line_contents).rem.str != (pSVar1->line_contents).full.str) {
    return false;
  }
  ahead = (pSVar1->line_contents).indentation;
  local_128.str = (pSVar1->line_contents).rem.str;
  local_128.len = (pSVar1->line_contents).rem.len;
  local_f0 = basic_substring<const_char>::triml(&local_128,' ');
  sVar13 = local_128.len;
  if ((local_f0.str != (char *)0x0 && local_f0.len != 0) && (*local_f0.str != '#')) {
    uVar2 = this->m_state->indref;
    if (ahead == uVar2) {
      if (local_128.len < ahead) {
        if (((s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
          pcVar4 = (code *)swi(3);
          uVar11 = (*pcVar4)();
          return (bool)uVar11;
        }
        handle_error(0x21a325,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x1533,"first >= 0 && first <= len");
      }
      basic_substring<const_char>::basic_substring
                (&local_118,local_128.str + ahead,local_128.len - ahead);
      if ((CONCAT17(local_118.len._7_1_,CONCAT16(local_118.len._6_1_,(undefined6)local_118.len)) ==
           0) || (*local_118.str != '-')) {
        uVar12 = this->m_state->flags;
        if ((uVar12 & 4) == 0) {
          if (((uVar12 & 8) != 0) && (2 < (this->m_stack).m_size)) {
            if ((uVar12 >> 8 & 1) == 0) {
              if (-1 < (char)uVar12) goto LAB_001e71c0;
              _append_val_null(this,local_128.str);
            }
            _pop_level(this);
            return true;
          }
        }
        else if ((~uVar12 & 0x280) == 0) {
          _append_key_val_null(this,local_128.str + (ahead - 1));
          this->m_state->flags = this->m_state->flags & 0xffffff3fU | 0x40;
        }
      }
LAB_001e71c0:
      _line_progressed(this,ahead);
      return ahead != 0;
    }
    if (uVar2 <= ahead) {
      if (ahead <= uVar2) {
        uStack_108 = 0x6d203e20646e;
        uStack_102 = 0x5f;
        uStack_101 = 0x73;
        uStack_100 = 0x3e2d65746174;
        local_118.str = (char *)0x6166206b63656863;
        local_118.len._0_6_ = 0x203a64656c69;
        local_118.len._6_1_ = 0x28;
        local_118.len._7_1_ = 0x69;
        uStack_fa = 0x69;
        uStack_f9 = 0x6e;
        uStack_f8 = 0x2966657264;
        if (((s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
          pcVar4 = (code *)swi(3);
          uVar11 = (*pcVar4)();
          return (bool)uVar11;
        }
        local_e0 = 0;
        uStack_d8 = 0x79dc;
        local_d0 = 0;
        pcStack_c8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_c0 = 0x65;
        in_stack_fffffffffffffea8 = (char *)0x0;
        in_stack_fffffffffffffeb0 = 0x79dc;
        LVar7.super_LineCol.col = 0;
        LVar7.super_LineCol.offset = SUB168(ZEXT816(0x79dc) << 0x40,0);
        LVar7.super_LineCol.line = SUB168(ZEXT816(0x79dc) << 0x40,8);
        LVar7.name.str =
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        LVar7.name.len = 0x65;
        (*(this->m_stack).m_callbacks.m_error)
                  ((char *)&local_118,0x26,LVar7,(this->m_stack).m_callbacks.m_user_data);
      }
      uVar12 = ~this->m_state->flags;
      if ((uVar12 & 0x84) == 0) {
        s.len = in_stack_fffffffffffffeb0;
        s.str = in_stack_fffffffffffffea8;
        bVar10 = anon_unknown_0::_is_scalar_next__rmap_val(s);
        if ((bVar10) &&
           (chars.len = 2, chars.str = ":?",
           sVar13 = basic_substring<const_char>::first_of(&local_f0,chars,0),
           sVar13 == 0xffffffffffffffff)) {
          return false;
        }
        this->m_state->flags = this->m_state->flags & 0xffffff3fU | 0x40;
        _push_level(this,false);
        _move_scalar_from_top(this);
        _line_progressed(this,ahead);
        _save_indentation(this,0);
        return true;
      }
      if ((uVar12 & 0x88) == 0) {
        return false;
      }
      bVar10 = is_debugger_attached();
      if ((bVar10) && (bVar10 = is_debugger_attached(), bVar10)) {
        pcVar4 = (code *)swi(3);
        uVar11 = (*pcVar4)();
        return (bool)uVar11;
      }
      fmt.len = 0x42;
      fmt.str = "ERROR: parse error - indentation should not increase at this point";
      _err<>(this,fmt);
      return false;
    }
    uVar12 = this->m_state->flags;
    if ((char)uVar12 < '\0') {
      if ((uVar12 & 4) == 0) {
        if ((uVar12 & 8) != 0) {
          if ((uVar12 >> 9 & 1) != 0) {
            uStack_108 = 0x6e6f6e5f7361;
            uStack_102 = 0x65;
            uStack_101 = 0x28;
            uStack_100 = 0x29294c435353;
            uStack_fa = 0;
            local_118.str = (char *)0x6166206b63656863;
            local_118.len._0_6_ = 0x203a64656c69;
            local_118.len._6_1_ = 0x28;
            local_118.len._7_1_ = 0x68;
            if (((s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
              pcVar4 = (code *)swi(3);
              uVar11 = (*pcVar4)();
              return (bool)uVar11;
            }
            local_90 = 0;
            uStack_88 = 0x7996;
            local_80 = 0;
            pcStack_78 = 
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            local_70 = 0x65;
            LVar6.super_LineCol.col = 0;
            LVar6.super_LineCol.offset = SUB168(ZEXT816(0x7996) << 0x40,0);
            LVar6.super_LineCol.line = SUB168(ZEXT816(0x7996) << 0x40,8);
            LVar6.name.str =
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            LVar6.name.len = 0x65;
            (*(this->m_stack).m_callbacks.m_error)
                      ((char *)&local_118,0x1f,LVar6,(this->m_stack).m_callbacks.m_user_data);
          }
          if (local_128.len < ahead) {
            if (((s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
              pcVar4 = (code *)swi(3);
              uVar11 = (*pcVar4)();
              return (bool)uVar11;
            }
            handle_error(0x21a325,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x1533,"first >= 0 && first <= len");
          }
          basic_substring<const_char>::basic_substring
                    (&local_118,local_128.str + ahead,local_128.len - ahead);
          _append_val_null(this,local_118.str + -1);
        }
      }
      else {
        if ((uVar12 >> 9 & 1) == 0) {
          uStack_108 = 0x6c6c615f7361;
          uStack_102 = 0x28;
          uStack_101 = 0x53;
          uStack_100 = 0x29294c4353;
          local_118.str = (char *)0x6166206b63656863;
          local_118.len._0_6_ = 0x203a64656c69;
          local_118.len._6_1_ = 0x28;
          local_118.len._7_1_ = 0x68;
          if (((s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
            pcVar4 = (code *)swi(3);
            uVar11 = (*pcVar4)();
            return (bool)uVar11;
          }
          local_68 = 0;
          uStack_60 = 0x7991;
          local_58 = 0;
          pcStack_50 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_48 = 0x65;
          LVar8.super_LineCol.col = 0;
          LVar8.super_LineCol.offset = SUB168(ZEXT816(0x7991) << 0x40,0);
          LVar8.super_LineCol.line = SUB168(ZEXT816(0x7991) << 0x40,8);
          LVar8.name.str =
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          LVar8.name.len = 0x65;
          (*(this->m_stack).m_callbacks.m_error)
                    ((char *)&local_118,0x1e,LVar8,(this->m_stack).m_callbacks.m_user_data);
        }
        if (local_128.len < ahead) {
          if (((s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
            pcVar4 = (code *)swi(3);
            uVar11 = (*pcVar4)();
            return (bool)uVar11;
          }
          handle_error(0x21a325,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1533,"first >= 0 && first <= len");
        }
        basic_substring<const_char>::basic_substring
                  (&local_118,local_128.str + ahead,local_128.len - ahead);
        _append_key_val_null(this,local_118.str + -1);
      }
    }
    pSVar3 = (this->m_stack).m_stack;
    pSVar1 = this->m_state;
    do {
      pSVar15 = pSVar1;
      pSVar1 = pSVar15 + -1;
      if (pSVar1 < pSVar3) {
        pSVar16 = (State *)0x0;
        goto LAB_001e736a;
      }
    } while (pSVar15[-1].indref != ahead);
    pSVar16 = pSVar1;
    if ((((pSVar3 < pSVar1) && (pSVar15[-2].indref == pSVar15[-1].indref)) &&
        (pNVar14 = Tree::_p(this->m_tree,pSVar15[-1].node_id),
        ((pNVar14->m_type).type & SEQ) != NOTYPE)) &&
       (pNVar14 = Tree::_p(this->m_tree,pSVar15[-2].node_id),
       ((pNVar14->m_type).type & MAP) != NOTYPE)) {
      pSVar16 = pSVar15 + -2;
      if ((local_f0.len != 0) && (pSVar16 = pSVar1, *local_f0.str != '-')) {
        pSVar16 = pSVar15 + -2;
      }
    }
LAB_001e736a:
    if (((pSVar16 == (State *)0x0) || (this->m_state <= pSVar16)) ||
       (this->m_state->level <= pSVar16->level)) {
      bVar10 = is_debugger_attached();
      if ((bVar10) && (bVar10 = is_debugger_attached(), bVar10)) {
        pcVar4 = (code *)swi(3);
        uVar11 = (*pcVar4)();
        return (bool)uVar11;
      }
      fmt_00.len = 0x2a;
      fmt_00.str = "ERROR: parse error: incorrect indentation?";
      _err<>(this,fmt_00);
    }
    while (this->m_state != pSVar16) {
      _pop_level(this);
    }
    sVar13 = ahead;
    if (ahead != this->m_state->indref) {
      uStack_108 = 0x203d3d20646e;
      uStack_102 = 0x6d;
      uStack_101 = 0x5f;
      uStack_100 = 0x2d6574617473;
      uStack_fa = 0x3e;
      local_118.str = (char *)0x6166206b63656863;
      local_118.len._0_6_ = 0x203a64656c69;
      local_118.len._6_1_ = 0x28;
      local_118.len._7_1_ = 0x69;
      uStack_f9 = 0x69;
      uStack_f8 = 0x29666572646e;
      uStack_f2 = 0;
      if (((s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
        pcVar4 = (code *)swi(3);
        uVar11 = (*pcVar4)();
        return (bool)uVar11;
      }
      local_b8 = 0;
      uStack_b0 = 0x79d5;
      local_a8 = 0;
      pcStack_a0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_98 = 0x65;
      LVar9.super_LineCol.col = 0;
      LVar9.super_LineCol.offset = SUB168(ZEXT816(0x79d5) << 0x40,0);
      LVar9.super_LineCol.line = SUB168(ZEXT816(0x79d5) << 0x40,8);
      LVar9.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      LVar9.name.len = 0x65;
      (*(this->m_stack).m_callbacks.m_error)
                ((char *)&local_118,0x27,LVar9,(this->m_stack).m_callbacks.m_user_data);
    }
  }
  _line_progressed(this,sVar13);
  return true;
}

Assistant:

bool Parser::_handle_indentation()
{
    _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(FLOW));
    if( ! _at_line_begin())
        return false;

    size_t ind = m_state->line_contents.indentation;
    csubstr rem = m_state->line_contents.rem;
    /** @todo instead of trimming, we should use the indentation index from above */
    csubstr remt = rem.triml(' ');

    if(remt.empty() || remt.begins_with('#')) // this is a blank or comment line
    {
        _line_progressed(rem.size());
        return true;
    }

    _c4dbgpf("indentation? ind={} indref={}", ind, m_state->indref);
    if(ind == m_state->indref)
    {
        _c4dbgpf("same indentation: {}", ind);
        if(!rem.sub(ind).begins_with('-'))
        {
            _c4dbgp("does not begin with -");
            if(has_any(RMAP))
            {
                if(has_all(SSCL|RVAL))
                {
                    _c4dbgp("add with null val");
                    _append_key_val_null(rem.str + ind - 1);
                    addrem_flags(RKEY, RVAL);
                }
            }
            else if(has_any(RSEQ))
            {
                if(m_stack.size() > 2) // do not pop to root level
                {
                    if(has_any(RNXT))
                    {
                        _c4dbgp("end the indentless seq");
                        _pop_level();
                        return true;
                    }
                    else if(has_any(RVAL))
                    {
                        _c4dbgp("add with null val");
                        _append_val_null(rem.str);
                        _c4dbgp("end the indentless seq");
                        _pop_level();
                        return true;
                    }
                }
            }
        }
        _line_progressed(ind);
        return ind > 0;
    }
    else if(ind < m_state->indref)
    {
        _c4dbgpf("smaller indentation ({} < {})!!!", ind, m_state->indref);
        if(has_all(RVAL))
        {
            _c4dbgp("there was an empty val -- appending");
            if(has_all(RMAP))
            {
                _RYML_CB_ASSERT(m_stack.m_callbacks, has_all(SSCL));
                _append_key_val_null(rem.sub(ind).str - 1);
            }
            else if(has_all(RSEQ))
            {
                _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(SSCL));
                _append_val_null(rem.sub(ind).str - 1);
            }
        }
        // search the stack frame to jump to based on its indentation
        State const* popto = nullptr;
        _RYML_CB_ASSERT(m_stack.m_callbacks, m_stack.is_contiguous()); // this search relies on the stack being contiguous
        for(State const* s = m_state-1; s >= m_stack.begin(); --s)
        {
            _c4dbgpf("searching for state with indentation {}. curr={} (level={},node={})", ind, s->indref, s->level, s->node_id);
            if(s->indref == ind)
            {
                _c4dbgpf("gotit!!! level={} node={}", s->level, s->node_id);
                popto = s;
                // while it may be tempting to think we're done at this
                // point, we must still determine whether we're jumping to a
                // parent with the same indentation. Consider this case with
                // an indentless sequence:
                //
                // product:
                // - sku: BL394D
                //   quantity: 4
                //   description: Basketball
                //   price: 450.00
                // - sku: BL4438H
                //   quantity: 1
                //   description: Super Hoop
                //   price: 2392.00  # jumping one level here would be wrong.
                // tax: 1234.5       # we must jump two levels
                if(popto > m_stack.begin())
                {
                    auto parent = popto - 1;
                    if(parent->indref == popto->indref)
                    {
                        _c4dbgpf("the parent (level={},node={}) has the same indentation ({}). is this in an indentless sequence?", parent->level, parent->node_id, popto->indref);
                        _c4dbgpf("isseq(popto)={} ismap(parent)={}", m_tree->is_seq(popto->node_id), m_tree->is_map(parent->node_id));
                        if(m_tree->is_seq(popto->node_id) && m_tree->is_map(parent->node_id))
                        {
                            if( ! remt.begins_with('-'))
                            {
                                _c4dbgp("this is an indentless sequence");
                                popto = parent;
                            }
                            else
                            {
                                _c4dbgp("not an indentless sequence");
                            }
                        }
                    }
                }
                break;
            }
        }
        if(!popto || popto >= m_state || popto->level >= m_state->level)
        {
            _c4err("parse error: incorrect indentation?");
        }
        _c4dbgpf("popping {} levels: from level {} to level {}", m_state->level-popto->level, m_state->level, popto->level);
        while(m_state != popto)
        {
            _c4dbgpf("popping level {} (indentation={})", m_state->level, m_state->indref);
            _pop_level();
        }
        _RYML_CB_ASSERT(m_stack.m_callbacks, ind == m_state->indref);
        _line_progressed(ind);
        return true;
    }
    else
    {
        _c4dbgpf("larger indentation ({} > {})!!!", ind, m_state->indref);
        _RYML_CB_ASSERT(m_stack.m_callbacks, ind > m_state->indref);
        if(has_all(RMAP|RVAL))
        {
            if(_is_scalar_next__rmap_val(remt) && remt.first_of(":?") == npos)
            {
                _c4dbgpf("actually it seems a value: '{}'", remt);
            }
            else
            {
                addrem_flags(RKEY, RVAL);
                _start_unk();
                //_move_scalar_from_top();
                _line_progressed(ind);
                _save_indentation();
                return true;
            }
        }
        else if(has_all(RSEQ|RVAL))
        {
            // nothing to do here
        }
        else
        {
            _c4err("parse error - indentation should not increase at this point");
        }
    }

    return false;
}